

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

RegOpnd * Lowerer::LoadGeneratorArgsPtr(Instr *instrInsert)

{
  uint32 offset;
  Instr *this;
  Opnd *this_00;
  RegOpnd *pRVar1;
  IndirOpnd *src;
  RegOpnd *argsPtrOpnd;
  IndirOpnd *indirOpnd;
  RegOpnd *generatorRegOpnd;
  Instr *instr;
  Instr *instrInsert_local;
  
  this = LoadGeneratorObject(instrInsert);
  this_00 = IR::Instr::GetDst(this);
  pRVar1 = IR::Opnd::AsRegOpnd(this_00);
  offset = Js::JavascriptGenerator::GetArgsPtrOffset();
  src = IR::IndirOpnd::New(pRVar1,offset,TyUint64,instrInsert->m_func,false);
  pRVar1 = IR::RegOpnd::New(TyInt64,instrInsert->m_func);
  InsertMove(&pRVar1->super_Opnd,&src->super_Opnd,instrInsert,true);
  return pRVar1;
}

Assistant:

IR::RegOpnd *
Lowerer::LoadGeneratorArgsPtr(IR::Instr *instrInsert)
{
    IR::Instr * instr = LoadGeneratorObject(instrInsert);
    IR::RegOpnd * generatorRegOpnd = instr->GetDst()->AsRegOpnd();

    IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(generatorRegOpnd, Js::JavascriptGenerator::GetArgsPtrOffset(), TyMachPtr, instrInsert->m_func);
    IR::RegOpnd * argsPtrOpnd = IR::RegOpnd::New(TyMachReg, instrInsert->m_func);
    Lowerer::InsertMove(argsPtrOpnd, indirOpnd, instrInsert);
    return argsPtrOpnd;
}